

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  char *pcVar1;
  int iVar2;
  CURLcode CVar3;
  CURLUcode CVar4;
  Curl_handler *pCVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  char *local_250;
  char *local_238;
  char *local_218;
  char *local_1f8;
  Curl_handler *local_1e0;
  char *local_1c0;
  char *local_1a8;
  char *local_190;
  char *local_180;
  undefined1 local_160 [8];
  dynbuf enc_2;
  size_t sStack_138;
  CURLcode res;
  size_t dlen;
  char *decoded;
  char *plus;
  size_t i;
  size_t partlen;
  undefined1 local_108 [4];
  CURLcode result;
  dynbuf enc_1;
  char *pcStack_e0;
  _Bool percent;
  char *host;
  size_t hostlen;
  dynbuf enc;
  Curl_handler *h_2;
  char *allochost;
  char *port;
  char *options;
  char *scheme;
  char *url;
  Curl_handler *h_1;
  Curl_handler *h;
  _Bool plusdecode;
  _Bool urlencode;
  _Bool urldecode;
  char portbuf [7];
  CURLUcode ifmissing;
  char *ptr;
  uint flags_local;
  char **part_local;
  CURLUPart what_local;
  CURLU *u_local;
  
  _urldecode = CURLUE_UNKNOWN_PART;
  h._4_1_ = (flags & 0x40) != 0;
  h._3_1_ = (flags & 0x80) != 0;
  h._2_1_ = 0;
  if (u == (CURLU *)0x0) {
    u_local._4_4_ = CURLUE_BAD_HANDLE;
  }
  else if (part == (char **)0x0) {
    u_local._4_4_ = CURLUE_BAD_PARTPOINTER;
  }
  else {
    *part = (char *)0x0;
    switch(what) {
    case CURLUPART_URL:
      port = u->options;
      allochost = u->port;
      h_2 = (Curl_handler *)0x0;
      if ((u->scheme == (char *)0x0) || (iVar2 = Curl_strcasecompare("file",u->scheme), iVar2 == 0))
      {
        if (u->host == (char *)0x0) {
          return CURLUE_NO_HOST;
        }
        enc.toobig = 0;
        if (u->scheme == (char *)0x0) {
          if ((flags & 4) == 0) {
            return CURLUE_NO_SCHEME;
          }
          options = "https";
        }
        else {
          options = u->scheme;
        }
        enc.toobig = (size_t)Curl_builtin_scheme(options,0xffffffffffffffff);
        if ((allochost == (char *)0x0) && ((flags & 1) != 0)) {
          if ((Curl_handler *)enc.toobig != (Curl_handler *)0x0) {
            curl_msnprintf((char *)((long)&h + 5),7,"%u",
                           (ulong)(uint)((Curl_handler *)enc.toobig)->defport);
            allochost = (char *)((long)&h + 5);
          }
        }
        else if ((allochost != (char *)0x0) &&
                ((((Curl_handler *)enc.toobig != (Curl_handler *)0x0 &&
                  ((long)((Curl_handler *)enc.toobig)->defport == u->portnum)) && ((flags & 2) != 0)
                 ))) {
          allochost = (char *)0x0;
        }
        if ((enc.toobig != 0) && ((*(uint *)(enc.toobig + 0x8c) & 0x400) == 0)) {
          port = (char *)0x0;
        }
        if (*u->host == '[') {
          if (u->zoneid != (char *)0x0) {
            sVar6 = strlen(u->host);
            Curl_dyn_init((dynbuf *)&hostlen,8000000);
            CVar3 = Curl_dyn_addf((dynbuf *)&hostlen,"%.*s%%25%s]",(ulong)((int)sVar6 - 1),u->host,
                                  u->zoneid);
            if (CVar3 != CURLE_OK) {
              return CURLUE_OUT_OF_MEMORY;
            }
            h_2 = (Curl_handler *)Curl_dyn_ptr((dynbuf *)&hostlen);
          }
        }
        else if ((h._3_1_ & 1) == 0) {
          pcStack_e0 = u->host;
          enc_1.toobig._7_1_ = '\0';
          for (; *pcStack_e0 != '\0'; pcStack_e0 = pcStack_e0 + 1) {
            if (*pcStack_e0 == '%') {
              enc_1.toobig._7_1_ = '\x01';
              break;
            }
          }
          if (enc_1.toobig._7_1_ != '\0') {
            Curl_dyn_init((dynbuf *)local_108,8000000);
            for (pcStack_e0 = u->host; *pcStack_e0 != '\0'; pcStack_e0 = pcStack_e0 + 1) {
              if (*pcStack_e0 == '%') {
                partlen._4_4_ = Curl_dyn_addn((dynbuf *)local_108,"%25",3);
              }
              else {
                partlen._4_4_ = Curl_dyn_addn((dynbuf *)local_108,pcStack_e0,1);
              }
              if (partlen._4_4_ != CURLE_OK) {
                return CURLUE_OUT_OF_MEMORY;
              }
            }
            (*Curl_cfree)(u->host);
            pcVar12 = Curl_dyn_ptr((dynbuf *)local_108);
            u->host = pcVar12;
          }
        }
        else {
          h_2 = (Curl_handler *)curl_easy_escape((Curl_easy *)0x0,u->host,0);
          if (h_2 == (Curl_handler *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
        }
        if (u->user == (char *)0x0) {
          local_190 = "";
        }
        else {
          local_190 = u->user;
        }
        pcVar12 = "PK\x01\x02";
        if (u->password != (char *)0x0) {
          pcVar12 = "    :";
        }
        if (u->password == (char *)0x0) {
          local_1a8 = "";
        }
        else {
          local_1a8 = u->password;
        }
        pcVar7 = "";
        if (port == (char *)0x0) {
          local_1c0 = "";
        }
        else {
          pcVar7 = ";";
          local_1c0 = port;
        }
        bVar13 = true;
        if ((u->user == (char *)0x0) && (bVar13 = true, u->password == (char *)0x0)) {
          bVar13 = port != (char *)0x0;
        }
        pcVar8 = "";
        if (bVar13) {
          pcVar8 = "@";
        }
        if (h_2 == (Curl_handler *)0x0) {
          local_1e0 = (Curl_handler *)u->host;
        }
        else {
          local_1e0 = h_2;
        }
        pcVar1 = "PK\x01\x02";
        if (allochost == (char *)0x0) {
          local_1f8 = "";
        }
        else {
          pcVar1 = "    :";
          local_1f8 = allochost;
        }
        bVar13 = false;
        if (u->path != (char *)0x0) {
          bVar13 = *u->path != '/';
        }
        pcVar9 = "";
        if (bVar13) {
          pcVar9 = "/";
        }
        if (u->path == (char *)0x0) {
          local_218 = "/";
        }
        else {
          local_218 = u->path;
        }
        bVar13 = false;
        if (u->query != (char *)0x0) {
          bVar13 = *u->query != '\0';
        }
        pcVar10 = "";
        if (bVar13) {
          pcVar10 = "?";
        }
        if ((u->query == (char *)0x0) || (*u->query == '\0')) {
          local_238 = "";
        }
        else {
          local_238 = u->query;
        }
        pcVar11 = "";
        if (u->fragment != (char *)0x0) {
          pcVar11 = "#";
        }
        if (u->fragment == (char *)0x0) {
          local_250 = "";
        }
        else {
          local_250 = u->fragment;
        }
        scheme = curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",options,local_190,pcVar12 + 4,
                               local_1a8,pcVar7,local_1c0,pcVar8,local_1e0,pcVar1 + 4,local_1f8,
                               pcVar9,local_218,pcVar10,local_238,pcVar11,local_250);
        (*Curl_cfree)(h_2);
      }
      else {
        pcVar12 = "";
        if (u->fragment != (char *)0x0) {
          pcVar12 = "#";
        }
        if (u->fragment == (char *)0x0) {
          local_180 = "";
        }
        else {
          local_180 = u->fragment;
        }
        scheme = curl_maprintf("file://%s%s%s",u->path,pcVar12,local_180);
      }
      if (scheme == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      *part = scheme;
      return CURLUE_OK;
    case CURLUPART_SCHEME:
      unique0x00012000 = u->scheme;
      _urldecode = CURLUE_NO_SCHEME;
      h._4_1_ = 0;
      break;
    case CURLUPART_USER:
      unique0x00012000 = u->user;
      _urldecode = CURLUE_NO_USER;
      break;
    case CURLUPART_PASSWORD:
      unique0x00012000 = u->password;
      _urldecode = CURLUE_NO_PASSWORD;
      break;
    case CURLUPART_OPTIONS:
      unique0x00012000 = u->options;
      _urldecode = CURLUE_NO_OPTIONS;
      break;
    case CURLUPART_HOST:
      unique0x00012000 = u->host;
      _urldecode = CURLUE_NO_HOST;
      break;
    case CURLUPART_PORT:
      unique0x00012000 = u->port;
      _urldecode = CURLUE_NO_PORT;
      h._4_1_ = 0;
      if (((unique0x00012000 == (char *)0x0) && ((flags & 1) != 0)) && (u->scheme != (char *)0x0)) {
        pCVar5 = Curl_builtin_scheme(u->scheme,0xffffffffffffffff);
        if (pCVar5 != (Curl_handler *)0x0) {
          curl_msnprintf((char *)((long)&h + 5),7,"%u",(ulong)(uint)pCVar5->defport);
          unique0x00004780 = (char *)((long)&h + 5);
        }
      }
      else if (((unique0x00012000 != (char *)0x0) && (u->scheme != (char *)0x0)) &&
              ((pCVar5 = Curl_builtin_scheme(u->scheme,0xffffffffffffffff),
               pCVar5 != (Curl_handler *)0x0 &&
               (((long)pCVar5->defport == u->portnum && ((flags & 2) != 0)))))) {
        stack0xffffffffffffffa0 = (char *)0x0;
      }
      break;
    case CURLUPART_PATH:
      unique0x00012000 = u->path;
      if (unique0x00012000 == (char *)0x0) {
        register0x00000000 = (*Curl_cstrdup)("/");
        u->path = register0x00000000;
        if (u->path == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      break;
    case CURLUPART_QUERY:
      unique0x00012000 = u->query;
      _urldecode = CURLUE_NO_QUERY;
      h._2_1_ = h._4_1_;
      break;
    case CURLUPART_FRAGMENT:
      unique0x00012000 = u->fragment;
      _urldecode = CURLUE_NO_FRAGMENT;
      break;
    case CURLUPART_ZONEID:
      unique0x00012000 = u->zoneid;
      _urldecode = CURLUE_NO_ZONEID;
      break;
    default:
      stack0xffffffffffffffa0 = (char *)0x0;
    }
    if (stack0xffffffffffffffa0 == (char *)0x0) {
      u_local._4_4_ = _urldecode;
    }
    else {
      i = strlen(stack0xffffffffffffffa0);
      plus = (char *)0x0;
      pcVar12 = (char *)Curl_memdup(stack0xffffffffffffffa0,i + 1);
      *part = pcVar12;
      if (*part == (char *)0x0) {
        u_local._4_4_ = CURLUE_OUT_OF_MEMORY;
      }
      else {
        if ((h._2_1_ & 1) != 0) {
          decoded = *part;
          for (plus = (char *)0x0; plus < i; plus = plus + 1) {
            if (*decoded == '+') {
              *decoded = ' ';
            }
            decoded = decoded + 1;
          }
        }
        if ((h._4_1_ & 1) != 0) {
          enc_2.toobig._4_4_ =
               Curl_urldecode(*part,0,(char **)&dlen,&stack0xfffffffffffffec8,REJECT_CTRL);
          (*Curl_cfree)(*part);
          if (enc_2.toobig._4_4_ != CURLE_OK) {
            *part = (char *)0x0;
            return CURLUE_URLDECODE;
          }
          *part = (char *)dlen;
          i = sStack_138;
        }
        if ((h._3_1_ & 1) != 0) {
          Curl_dyn_init((dynbuf *)local_160,8000000);
          CVar4 = urlencode_str((dynbuf *)local_160,*part,i,true,what == CURLUPART_QUERY);
          if (CVar4 != CURLUE_OK) {
            return CURLUE_OUT_OF_MEMORY;
          }
          (*Curl_cfree)(*part);
          pcVar12 = Curl_dyn_ptr((dynbuf *)local_160);
          *part = pcVar12;
        }
        u_local._4_4_ = CURLUE_OK;
      }
    }
  }
  return u_local._4_4_;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool urlencode = (flags & CURLU_URLENCODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_ZONEID:
    ptr = u->zoneid;
    ifmissing = CURLUE_NO_ZONEID;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme, CURL_ZERO_TERMINATED);
      if(h) {
        msnprintf(portbuf, sizeof(portbuf), "%u", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme, CURL_ZERO_TERMINATED);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    char *allochost = NULL;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      h = Curl_builtin_scheme(scheme, CURL_ZERO_TERMINATED);
      if(!port && (flags & CURLU_DEFAULT_PORT)) {
        /* there's no stored port number, but asked to deliver
           a default one for the scheme */
        if(h) {
          msnprintf(portbuf, sizeof(portbuf), "%u", h->defport);
          port = portbuf;
        }
      }
      else if(port) {
        /* there is a stored port number, but asked to inhibit if it matches
           the default one for the scheme */
        if(h && (h->defport == u->portnum) &&
           (flags & CURLU_NO_DEFAULT_PORT))
          port = NULL;
      }

      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      if(u->host[0] == '[') {
        if(u->zoneid) {
          /* make it '[ host %25 zoneid ]' */
          struct dynbuf enc;
          size_t hostlen = strlen(u->host);
          Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
          if(Curl_dyn_addf(&enc, "%.*s%%25%s]", (int)hostlen - 1, u->host,
                           u->zoneid))
            return CURLUE_OUT_OF_MEMORY;
          allochost = Curl_dyn_ptr(&enc);
        }
      }
      else if(urlencode) {
        allochost = curl_easy_escape(NULL, u->host, 0);
        if(!allochost)
          return CURLUE_OUT_OF_MEMORY;
      }
      else {
        /* only encode '%' in output host name */
        char *host = u->host;
        bool percent = FALSE;
        /* first, count number of percents present in the name */
        while(*host) {
          if(*host == '%') {
            percent = TRUE;
            break;
          }
          host++;
        }
        /* if there were percent(s), encode the host name */
        if(percent) {
          struct dynbuf enc;
          CURLcode result;
          Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
          host = u->host;
          while(*host) {
            if(*host == '%')
              result = Curl_dyn_addn(&enc, "%25", 3);
            else
              result = Curl_dyn_addn(&enc, host, 1);
            if(result)
              return CURLUE_OUT_OF_MEMORY;
            host++;
          }
          free(u->host);
          u->host = Curl_dyn_ptr(&enc);
        }
      }

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    allochost ? allochost : u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    (u->query && u->query[0]) ? "?": "",
                    (u->query && u->query[0]) ? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
      free(allochost);
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
  }
  default:
    ptr = NULL;
    break;
  }
  if(ptr) {
    size_t partlen = strlen(ptr);
    size_t i = 0;
    *part = Curl_memdup(ptr, partlen + 1);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus = *part;
      for(i = 0; i < partlen; ++plus, i++) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      /* this unconditional rejection of control bytes is documented
         API behavior */
      CURLcode res = Curl_urldecode(*part, 0, &decoded, &dlen, REJECT_CTRL);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
      partlen = dlen;
    }
    if(urlencode) {
      struct dynbuf enc;
      Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
      if(urlencode_str(&enc, *part, partlen, TRUE,
                       what == CURLUPART_QUERY))
        return CURLUE_OUT_OF_MEMORY;
      free(*part);
      *part = Curl_dyn_ptr(&enc);
    }

    return CURLUE_OK;
  }
  else
    return ifmissing;
}